

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Stable_options>::insert_node_<false,true,false,double_const&>
          (Simplex_tree<Stable_options> *this,Siblings *sib,Vertex_handle v,double *filtration_value
          )

{
  int iVar1;
  uint uVar2;
  node_ptr pcVar3;
  insert_commit_data *commit_data;
  bool bVar4;
  undefined4 in_register_00000014;
  node_ptr pcVar5;
  node_ptr pcVar6;
  ulong uVar7;
  ulong extraout_RDX;
  int iVar8;
  undefined8 *in_R8;
  size_holder<true,_unsigned_long,_void> sVar9;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  pVar10;
  size_holder<true,_unsigned_long,_void> local_48;
  undefined1 local_40;
  node_ptr local_38;
  
  pcVar5 = (node_ptr)CONCAT44(in_register_00000014,v);
  pcVar6 = (node_ptr)((ulong)pcVar5[1].parent_ & 0xfffffffffffffffe);
  iVar8 = (int)filtration_value;
  if (pcVar6 == (node_ptr)0x0) {
    pcVar3 = pcVar5 + 1;
    bVar4 = true;
  }
  else {
    sVar9.size_ = 0;
    do {
      pcVar3 = pcVar6;
      iVar1 = *(int *)&pcVar3[1].parent_;
      bVar4 = iVar8 < iVar1;
      if (iVar1 <= iVar8) {
        sVar9.size_ = (unsigned_long)pcVar3;
      }
      pcVar6 = (&pcVar3->left_)[iVar1 <= iVar8];
    } while ((&pcVar3->left_)[iVar1 <= iVar8] != (node_ptr)0x0);
    if (((node_ptr)sVar9.size_ != (node_ptr)0x0) &&
       (uVar2 = *(uint *)&((node_ptr)(sVar9.size_ + 0x18))->parent_, iVar8 <= (int)uVar2)) {
      (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)sVar9.size_;
      *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 0;
      goto LAB_0011eefa;
    }
  }
  local_40 = bVar4;
  local_38 = pcVar3;
  commit_data = (insert_commit_data *)operator_new(0x38);
  *(int *)&commit_data[1].node = iVar8;
  *(undefined8 *)(commit_data + 2) = *in_R8;
  *(undefined4 *)&commit_data[2].node = 0xffffffff;
  *(node_ptr *)(commit_data + 3) = pcVar5;
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  ::insert_unique_commit
            ((bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
              *)&local_48,(reference)&pcVar5->right_,commit_data);
  (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)local_48.size_;
  *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  if ((_Hash_node_base *)local_48.size_ == (_Hash_node_base *)0x0) {
    __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                  "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                 );
  }
  uVar2 = *(uint *)&((_Hash_node_base *)(local_48.size_ + 0x18))->_M_nxt;
  sVar9.size_ = local_48.size_;
LAB_0011eefa:
  uVar7 = (ulong)uVar2;
  if (*(uint *)&((node_ptr)(sVar9.size_ + 0x30))->parent_->left_ != uVar2) {
    pcVar6 = (node_ptr)operator_new(0x30);
    pcVar6->parent_ = pcVar5;
    *(int *)&pcVar6->left_ = iVar8;
    pcVar6[1].left_ = pcVar6 + 1;
    pcVar6[1].right_ = pcVar6 + 1;
    pcVar6->right_ = (node_ptr)0x0;
    pcVar6[1].parent_ = (node_ptr)0x0;
    ((node_ptr)(sVar9.size_ + 0x30))->parent_ = pcVar6;
    uVar7 = extraout_RDX;
  }
  pVar10._8_8_ = uVar7;
  pVar10.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar10;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }